

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodemv.c
# Opt level: O1

void read_palette_mode_info(AV1_COMMON *cm,MACROBLOCKD *xd,aom_reader *r)

{
  PALETTE_MODE_INFO *colors;
  od_ec_dec *poVar1;
  aom_cdf_prob *paVar2;
  ushort uVar3;
  aom_bit_depth_t aVar4;
  MB_MODE_INFO *pMVar5;
  FRAME_CONTEXT *pFVar6;
  short sVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  byte bVar14;
  byte bVar15;
  ushort uVar16;
  int iVar17;
  uint uVar18;
  uint8_t uVar19;
  uint16_t uVar20;
  int literal;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  int literal_3;
  aom_cdf_prob (*paaVar24) [3];
  aom_cdf_prob (*paaVar25) [8];
  int literal_1;
  uint uVar26;
  int iVar27;
  uint uVar28;
  ulong uVar29;
  bool bVar30;
  int n_cached_colors;
  uint16_t cached_colors [8];
  uint16_t color_cache [16];
  uint16_t local_78 [8];
  ulong local_68;
  aom_reader *local_60;
  uint16_t local_58 [20];
  
  uVar19 = cm->seq_params->monochrome;
  pMVar5 = *xd->mi;
  colors = &pMVar5->palette_mode_info;
  bVar15 = "\x04\x05\x05\x06\a\a\b\t\t\n\v\v\f\r\r\x0e\x06\x06\b\b\n\n"[pMVar5->bsize];
  iVar17 = bVar15 - 6;
  if (pMVar5->mode == '\0') {
    uVar8 = 0;
    if (xd->above_mbmi != (MB_MODE_INFO *)0x0) {
      uVar8 = (uint)((xd->above_mbmi->palette_mode_info).palette_size[0] != '\0');
    }
    if (xd->left_mbmi != (MB_MODE_INFO *)0x0) {
      uVar8 = (uVar8 + 1) - (uint)((xd->left_mbmi->palette_mode_info).palette_size[0] == '\0');
    }
    pFVar6 = xd->tile_ctx;
    paaVar24 = pFVar6->palette_y_mode_cdf[(ulong)bVar15 - 6] + uVar8;
    poVar1 = &r->ec;
    iVar9 = od_ec_decode_cdf_q15(poVar1,*paaVar24,2);
    if (r->allow_update_cdf != '\0') {
      uVar16 = pFVar6->palette_y_mode_cdf[(ulong)bVar15 - 6][uVar8][2];
      bVar14 = (char)(uVar16 >> 4) + 4;
      uVar3 = (*paaVar24)[0];
      if ((char)iVar9 < '\x01') {
        sVar7 = -(uVar3 >> (bVar14 & 0x1f));
      }
      else {
        sVar7 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar14 & 0x1f));
      }
      (*paaVar24)[0] = sVar7 + uVar3;
      paVar2 = pFVar6->palette_y_mode_cdf[(ulong)bVar15 - 6][uVar8] + 2;
      *paVar2 = *paVar2 + (ushort)(uVar16 < 0x20);
    }
    if (iVar9 != 0) {
      pFVar6 = xd->tile_ctx;
      paaVar25 = pFVar6->palette_y_size_cdf + ((ulong)bVar15 - 6);
      iVar9 = od_ec_decode_cdf_q15(poVar1,*paaVar25,7);
      if (r->allow_update_cdf != '\0') {
        uVar16 = pFVar6->palette_y_size_cdf[(ulong)bVar15 - 6][7];
        bVar14 = (char)(uVar16 >> 4) + 5;
        lVar23 = 0;
        do {
          uVar3 = (*paaVar25)[lVar23];
          if (lVar23 < (char)iVar9) {
            sVar7 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar14 & 0x1f));
          }
          else {
            sVar7 = -(uVar3 >> (bVar14 & 0x1f));
          }
          (*paaVar25)[lVar23] = sVar7 + uVar3;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 6);
        paVar2 = pFVar6->palette_y_size_cdf[(ulong)bVar15 - 6] + 7;
        *paVar2 = *paVar2 + (ushort)(uVar16 < 0x20);
      }
      (pMVar5->palette_mode_info).palette_size[0] = (char)iVar9 + '\x02';
      aVar4 = cm->seq_params->bit_depth;
      local_60 = r;
      uVar8 = av1_get_palette_cache(xd,0,local_58);
      bVar15 = (pMVar5->palette_mode_info).palette_size[0];
      bVar30 = bVar15 != 0;
      uVar21 = (uint)bVar15;
      if ((int)uVar8 < 1) {
        uVar22 = 0;
      }
      else {
        uVar22 = 0;
        if (bVar15 != 0) {
          uVar22 = 0;
          uVar29 = 1;
          do {
            iVar9 = od_ec_decode_bool_q15(poVar1,0x4000);
            if (iVar9 != 0) {
              iVar9 = (int)uVar22;
              uVar22 = (ulong)(iVar9 + 1);
              local_78[iVar9] = local_58[uVar29 - 1];
            }
            bVar30 = (int)uVar22 < (int)uVar21;
          } while ((uVar29 < uVar8) && (uVar29 = uVar29 + 1, (int)uVar22 < (int)uVar21));
        }
      }
      if (bVar30) {
        uVar8 = 0;
        uVar20 = 0;
        local_68 = uVar22;
        if (0 < (int)aVar4) {
          iVar9 = aVar4 + 1;
          do {
            iVar10 = od_ec_decode_bool_q15(poVar1,0x4000);
            uVar8 = uVar8 | iVar10 << ((char)iVar9 - 2U & 0x1f);
            uVar20 = (uint16_t)uVar8;
            iVar9 = iVar9 + -1;
          } while (1 < iVar9);
        }
        iVar9 = (int)local_68;
        colors->palette_colors[iVar9] = uVar20;
        if (iVar9 + 1 < (int)uVar21) {
          uVar8 = 0;
          uVar21 = 3;
          do {
            iVar10 = od_ec_decode_bool_q15(poVar1,0x4000);
            uVar8 = uVar8 | iVar10 << ((char)uVar21 - 2U & 0x1f);
            uVar21 = uVar21 - 1;
          } while (1 < uVar21);
          iVar11 = 1 << ((byte)aVar4 & 0x1f);
          iVar27 = ~(uint)colors->palette_colors[iVar9] + iVar11;
          iVar10 = uVar8 + aVar4 + -3;
          iVar11 = iVar11 + -1;
          lVar23 = (long)(iVar9 + 1);
          do {
            iVar9 = 1;
            if (0 < iVar10) {
              iVar9 = iVar10 + 1;
              uVar8 = 0;
              do {
                iVar12 = od_ec_decode_bool_q15(poVar1,0x4000);
                uVar8 = uVar8 | iVar12 << ((char)iVar9 - 2U & 0x1f);
                iVar9 = iVar9 + -1;
              } while (1 < iVar9);
              iVar9 = uVar8 + 1;
            }
            uVar8 = (uint)(pMVar5->palette_mode_info).palette_colors[lVar23 + -1];
            iVar9 = iVar9 + uVar8;
            iVar12 = iVar11;
            if (iVar9 < iVar11) {
              iVar12 = iVar9;
            }
            uVar16 = (ushort)iVar12;
            if (iVar9 < 0) {
              uVar16 = 0;
            }
            iVar9 = uVar8 - uVar16;
            uVar21 = (iVar27 + iVar9) - 1;
            iVar27 = iVar9 + iVar27;
            uVar8 = 0x1f;
            if (uVar21 != 0) {
              for (; uVar21 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            iVar9 = (uVar8 ^ 0xffffffe0) + 0x21;
            if (iVar27 < 2) {
              iVar9 = 0;
            }
            if (iVar9 <= iVar10) {
              iVar10 = iVar9;
            }
            colors->palette_colors[lVar23] = uVar16;
            lVar23 = lVar23 + 1;
          } while ((uint)lVar23 != (uint)bVar15);
        }
        merge_colors(colors->palette_colors,local_78,(uint)bVar15,(int)local_68);
        r = local_60;
      }
      else {
        memcpy(colors,local_78,(ulong)(uVar21 * 2));
        r = local_60;
      }
    }
  }
  if (((uVar19 == '\0') && (pMVar5->uv_mode == '\0')) && (xd->is_chroma_ref == true)) {
    paaVar24 = xd->tile_ctx->palette_uv_mode_cdf +
               ((pMVar5->palette_mode_info).palette_size[0] != '\0');
    poVar1 = &r->ec;
    iVar9 = od_ec_decode_cdf_q15(poVar1,*paaVar24,2);
    if (r->allow_update_cdf != '\0') {
      uVar16 = (*paaVar24)[2];
      bVar15 = (char)(uVar16 >> 4) + 4;
      uVar3 = (*paaVar24)[0];
      if ((char)iVar9 < '\x01') {
        sVar7 = -(uVar3 >> (bVar15 & 0x1f));
      }
      else {
        sVar7 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar15 & 0x1f));
      }
      (*paaVar24)[0] = sVar7 + uVar3;
      (*paaVar24)[2] = (*paaVar24)[2] + (ushort)(uVar16 < 0x20);
    }
    if (iVar9 != 0) {
      pFVar6 = xd->tile_ctx;
      paaVar25 = pFVar6->palette_uv_size_cdf + iVar17;
      iVar9 = od_ec_decode_cdf_q15(poVar1,*paaVar25,7);
      if (r->allow_update_cdf != '\0') {
        uVar16 = pFVar6->palette_uv_size_cdf[iVar17][7];
        bVar15 = (char)(uVar16 >> 4) + 5;
        lVar23 = 0;
        do {
          uVar3 = (*paaVar25)[lVar23];
          if (lVar23 < (char)(byte)iVar9) {
            sVar7 = (short)((int)(0x8000 - (uint)uVar3) >> (bVar15 & 0x1f));
          }
          else {
            sVar7 = -(uVar3 >> (bVar15 & 0x1f));
          }
          (*paaVar25)[lVar23] = sVar7 + uVar3;
          lVar23 = lVar23 + 1;
        } while (lVar23 != 6);
        paVar2 = pFVar6->palette_uv_size_cdf[iVar17] + 7;
        *paVar2 = *paVar2 + (ushort)(uVar16 < 0x20);
      }
      uVar19 = (uint8_t)(iVar9 + 2U);
      (pMVar5->palette_mode_info).palette_size[1] = uVar19;
      aVar4 = cm->seq_params->bit_depth;
      uVar21 = iVar9 + 2U & 0xff;
      uVar8 = av1_get_palette_cache(xd,1,local_58);
      bVar30 = uVar19 != '\0';
      iVar17 = 0;
      if ((0 < (int)uVar8) && (uVar19 != '\0')) {
        iVar17 = 0;
        uVar22 = 1;
        do {
          iVar10 = od_ec_decode_bool_q15(poVar1,0x4000);
          if (iVar10 != 0) {
            lVar23 = (long)iVar17;
            iVar17 = iVar17 + 1;
            local_78[lVar23] = local_58[uVar22 - 1];
          }
          bVar30 = iVar17 < (int)uVar21;
        } while ((uVar22 < uVar8) && (uVar22 = uVar22 + 1, iVar17 < (int)uVar21));
      }
      if (bVar30) {
        uVar8 = 0;
        uVar20 = 0;
        if (0 < (int)aVar4) {
          iVar10 = aVar4 + 1;
          do {
            iVar11 = od_ec_decode_bool_q15(poVar1,0x4000);
            uVar8 = uVar8 | iVar11 << ((char)iVar10 - 2U & 0x1f);
            uVar20 = (uint16_t)uVar8;
            iVar10 = iVar10 + -1;
          } while (1 < iVar10);
        }
        colors->palette_colors[iVar17 + 8] = uVar20;
        if (iVar17 + 9 < (int)(uVar21 + 8)) {
          uVar8 = 0;
          uVar28 = 3;
          do {
            iVar10 = od_ec_decode_bool_q15(poVar1,0x4000);
            uVar8 = uVar8 | iVar10 << ((char)uVar28 - 2U & 0x1f);
            uVar28 = uVar28 - 1;
          } while (1 < uVar28);
          iVar27 = 1 << ((byte)aVar4 & 0x1f);
          iVar11 = iVar27 - (uint)colors->palette_colors[iVar17 + 8];
          iVar10 = aVar4 + uVar8 + -3;
          iVar27 = iVar27 + -1;
          lVar23 = (long)(iVar17 + 9);
          do {
            uVar8 = 0;
            if (0 < iVar10) {
              iVar12 = iVar10 + 1;
              uVar8 = 0;
              do {
                iVar13 = od_ec_decode_bool_q15(poVar1,0x4000);
                uVar8 = uVar8 | iVar13 << ((char)iVar12 - 2U & 0x1f);
                iVar12 = iVar12 + -1;
              } while (1 < iVar12);
            }
            uVar28 = (uint)(pMVar5->palette_mode_info).palette_colors[lVar23 + -1];
            iVar13 = uVar8 + uVar28;
            iVar12 = iVar27;
            if (iVar13 < iVar27) {
              iVar12 = iVar13;
            }
            uVar16 = (ushort)iVar12;
            if (iVar13 < 0) {
              uVar16 = 0;
            }
            iVar12 = uVar28 - uVar16;
            uVar28 = (iVar12 + iVar11) - 1;
            iVar11 = iVar12 + iVar11;
            uVar8 = 0x1f;
            if (uVar28 != 0) {
              for (; uVar28 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            iVar12 = (uVar8 ^ 0xffffffe0) + 0x21;
            if (iVar11 < 2) {
              iVar12 = 0;
            }
            if (iVar12 <= iVar10) {
              iVar10 = iVar12;
            }
            colors->palette_colors[lVar23] = uVar16;
            lVar23 = lVar23 + 1;
          } while (uVar21 + 8 != (int)lVar23);
        }
        merge_colors((pMVar5->palette_mode_info).palette_colors + 8,local_78,uVar21,iVar17);
      }
      else {
        memcpy((pMVar5->palette_mode_info).palette_colors + 8,local_78,(ulong)(uVar21 * 2));
      }
      iVar17 = od_ec_decode_bool_q15(poVar1,0x4000);
      if (iVar17 == 0) {
        if (uVar21 != 0) {
          uVar22 = 0;
          do {
            uVar8 = 0;
            uVar20 = 0;
            iVar17 = aVar4 + 1;
            if (0 < (int)aVar4) {
              do {
                iVar9 = od_ec_decode_bool_q15(poVar1,0x4000);
                uVar8 = uVar8 | iVar9 << ((char)iVar17 - 2U & 0x1f);
                uVar20 = (uint16_t)uVar8;
                iVar17 = iVar17 + -1;
              } while (1 < iVar17);
            }
            (pMVar5->palette_mode_info).palette_colors[uVar22 + 0x10] = uVar20;
            uVar22 = uVar22 + 1;
          } while (uVar22 != uVar21);
        }
      }
      else {
        uVar8 = 0;
        uVar28 = 3;
        do {
          iVar17 = od_ec_decode_bool_q15(poVar1,0x4000);
          uVar8 = uVar8 | iVar17 << ((char)uVar28 - 2U & 0x1f);
          uVar28 = uVar28 - 1;
        } while (1 < uVar28);
        uVar26 = 1 << ((byte)aVar4 & 0x1f);
        uVar28 = 0;
        uVar20 = 0;
        if (0 < (int)aVar4) {
          iVar17 = aVar4 + 1;
          do {
            iVar10 = od_ec_decode_bool_q15(poVar1,0x4000);
            uVar28 = uVar28 | iVar10 << ((char)iVar17 - 2U & 0x1f);
            uVar20 = (uint16_t)uVar28;
            iVar17 = iVar17 + -1;
          } while (1 < iVar17);
        }
        (pMVar5->palette_mode_info).palette_colors[0x10] = uVar20;
        if ((byte)iVar9 < 0xfe) {
          uVar22 = 1;
          do {
            uVar28 = 0;
            if (0 < (int)(aVar4 + uVar8 + -4)) {
              uVar28 = 0;
              iVar17 = aVar4 + uVar8 + -5;
              do {
                iVar9 = od_ec_decode_bool_q15(poVar1,0x4000);
                uVar28 = uVar28 | iVar9 << ((byte)iVar17 & 0x1f);
                iVar9 = iVar17 + 1;
                iVar17 = iVar17 + -1;
              } while (1 < iVar9);
            }
            if (uVar28 == 0) {
              uVar18 = 0;
            }
            else {
              iVar17 = od_ec_decode_bool_q15(poVar1,0x4000);
              uVar18 = -uVar28;
              if (iVar17 == 0) {
                uVar18 = uVar28;
              }
            }
            iVar17 = (pMVar5->palette_mode_info).palette_colors[uVar22 + 0xf] + uVar18;
            iVar17 = (iVar17 >> 0x1f & uVar26) + iVar17;
            uVar28 = uVar26;
            if (iVar17 < (int)uVar26) {
              uVar28 = 0;
            }
            (pMVar5->palette_mode_info).palette_colors[uVar22 + 0x10] =
                 (short)iVar17 - (short)uVar28;
            uVar22 = uVar22 + 1;
          } while (uVar22 != uVar21);
        }
      }
    }
  }
  return;
}

Assistant:

static void read_palette_mode_info(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                                   aom_reader *r) {
  const int num_planes = av1_num_planes(cm);
  MB_MODE_INFO *const mbmi = xd->mi[0];
  const BLOCK_SIZE bsize = mbmi->bsize;
  assert(av1_allow_palette(cm->features.allow_screen_content_tools, bsize));
  PALETTE_MODE_INFO *const pmi = &mbmi->palette_mode_info;
  const int bsize_ctx = av1_get_palette_bsize_ctx(bsize);

  if (mbmi->mode == DC_PRED) {
    const int palette_mode_ctx = av1_get_palette_mode_ctx(xd);
    const int modev = aom_read_symbol(
        r, xd->tile_ctx->palette_y_mode_cdf[bsize_ctx][palette_mode_ctx], 2,
        ACCT_STR);
    if (modev) {
      pmi->palette_size[0] =
          aom_read_symbol(r, xd->tile_ctx->palette_y_size_cdf[bsize_ctx],
                          PALETTE_SIZES, ACCT_STR) +
          2;
      read_palette_colors_y(xd, cm->seq_params->bit_depth, pmi, r);
    }
  }
  if (num_planes > 1 && mbmi->uv_mode == UV_DC_PRED && xd->is_chroma_ref) {
    const int palette_uv_mode_ctx = (pmi->palette_size[0] > 0);
    const int modev = aom_read_symbol(
        r, xd->tile_ctx->palette_uv_mode_cdf[palette_uv_mode_ctx], 2, ACCT_STR);
    if (modev) {
      pmi->palette_size[1] =
          aom_read_symbol(r, xd->tile_ctx->palette_uv_size_cdf[bsize_ctx],
                          PALETTE_SIZES, ACCT_STR) +
          2;
      read_palette_colors_uv(xd, cm->seq_params->bit_depth, pmi, r);
    }
  }
}